

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_Geometry3D_ElevationGrid(X3DImporter *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FIReader *pFVar3;
  char *pcVar4;
  pointer pcVar5;
  CX3DImporter_NodeElement *pCVar6;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar7;
  X3DImporter *pXVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  int32_t iVar12;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _List_node_base *p_Var13;
  runtime_error *prVar14;
  ulong uVar15;
  ulong uVar16;
  int32_t zi;
  float fVar17;
  string *psVar18;
  uint pAttrIdx;
  float fVar19;
  char *__end;
  pointer pfVar20;
  int32_t xi;
  int iVar21;
  vector<int,_std::allocator<int>_> *this_00;
  CX3DImporter_NodeElement *pCVar22;
  pointer pcVar23;
  ulong uVar24;
  string an;
  string use;
  CX3DImporter_NodeElement *ne;
  vector<float,_std::allocator<float>_> height;
  string def;
  bool local_fc;
  bool local_fb;
  bool local_fa;
  bool local_f9;
  string local_f8;
  int32_t local_d4;
  float local_d0;
  float local_cc;
  string local_c8;
  ulong local_a8;
  float local_9c;
  float local_98;
  allocator<char> local_91;
  CX3DImporter_NodeElement *local_90;
  ulong local_88;
  CX3DImporter_NodeElement *local_80;
  vector<float,_std::allocator<float>_> local_78;
  X3DImporter *local_58;
  string local_50;
  undefined4 extraout_var_00;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_80 = (CX3DImporter_NodeElement *)0x0;
  uVar10 = (*(((this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
             super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  local_58 = this;
  if ((int)uVar10 < 1) {
    local_a8 = 0;
    local_fa = true;
    local_9c = 0.0;
    local_d4 = 0;
    local_cc = 1.0;
    local_d0 = 1.0;
    local_fc = true;
    local_fb = true;
    local_f9 = true;
  }
  else {
    pAttrIdx = 0;
    local_9c = 0.0;
    local_f9 = true;
    local_fb = true;
    local_fc = true;
    local_fa = true;
    local_d0 = 1.0;
    local_cc = 1.0;
    local_d4 = 0;
    local_a8 = 0;
    do {
      pXVar8 = local_58;
      pFVar3 = (local_58->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar11 = (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                         (pFVar3,(ulong)pAttrIdx);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,(char *)CONCAT44(extraout_var,iVar11),&local_91);
      iVar11 = std::__cxx11::string::compare((char *)&local_f8);
      if (iVar11 == 0) {
        iVar11 = (*(((pXVar8->mReader)._M_t.
                     super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                     .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                   super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar11);
        psVar18 = &local_50;
LAB_00690de4:
        pcVar4 = (char *)psVar18->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar18,0,pcVar4,(ulong)__s);
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)&local_f8);
        if (iVar11 == 0) {
          iVar11 = (*(((pXVar8->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar11);
          psVar18 = &local_c8;
          goto LAB_00690de4;
        }
        iVar11 = std::__cxx11::string::compare((char *)&local_f8);
        if (((iVar11 != 0) &&
            (iVar11 = std::__cxx11::string::compare((char *)&local_f8), iVar11 != 0)) &&
           (iVar11 = std::__cxx11::string::compare((char *)&local_f8), iVar11 != 0)) {
          iVar11 = std::__cxx11::string::compare((char *)&local_f8);
          if (iVar11 == 0) {
            local_fa = XML_ReadNode_GetAttrVal_AsBool(pXVar8,pAttrIdx);
          }
          else {
            iVar11 = std::__cxx11::string::compare((char *)&local_f8);
            if (iVar11 == 0) {
              local_f9 = XML_ReadNode_GetAttrVal_AsBool(pXVar8,pAttrIdx);
            }
            else {
              iVar11 = std::__cxx11::string::compare((char *)&local_f8);
              if (iVar11 == 0) {
                local_fb = XML_ReadNode_GetAttrVal_AsBool(pXVar8,pAttrIdx);
              }
              else {
                iVar11 = std::__cxx11::string::compare((char *)&local_f8);
                if (iVar11 == 0) {
                  local_fc = XML_ReadNode_GetAttrVal_AsBool(pXVar8,pAttrIdx);
                }
                else {
                  iVar11 = std::__cxx11::string::compare((char *)&local_f8);
                  if (iVar11 == 0) {
                    local_9c = XML_ReadNode_GetAttrVal_AsFloat(pXVar8,pAttrIdx);
                  }
                  else {
                    iVar11 = std::__cxx11::string::compare((char *)&local_f8);
                    if (iVar11 == 0) {
                      XML_ReadNode_GetAttrVal_AsArrF(pXVar8,pAttrIdx,&local_78);
                    }
                    else {
                      iVar11 = std::__cxx11::string::compare((char *)&local_f8);
                      if (iVar11 == 0) {
                        iVar12 = XML_ReadNode_GetAttrVal_AsI32(pXVar8,pAttrIdx);
                        local_a8 = CONCAT44(extraout_var_02,iVar12);
                      }
                      else {
                        iVar11 = std::__cxx11::string::compare((char *)&local_f8);
                        if (iVar11 == 0) {
                          local_cc = XML_ReadNode_GetAttrVal_AsFloat(pXVar8,pAttrIdx);
                        }
                        else {
                          iVar11 = std::__cxx11::string::compare((char *)&local_f8);
                          if (iVar11 == 0) {
                            local_d4 = XML_ReadNode_GetAttrVal_AsI32(pXVar8,pAttrIdx);
                          }
                          else {
                            iVar11 = std::__cxx11::string::compare((char *)&local_f8);
                            if (iVar11 == 0) {
                              local_d0 = XML_ReadNode_GetAttrVal_AsFloat(pXVar8,pAttrIdx);
                            }
                            else {
                              Throw_IncorrectAttr(pXVar8,&local_f8);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      pAttrIdx = pAttrIdx + 1;
    } while (uVar10 != pAttrIdx);
  }
  pXVar8 = local_58;
  if (local_c8._M_string_length == 0) {
    if (((local_cc == 0.0) && (!NAN(local_cc))) || ((local_d0 == 0.0 && (!NAN(local_d0))))) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"Spacing in <ElevationGrid> must be grater than zero.","");
      std::runtime_error::runtime_error(prVar14,(string *)&local_f8);
      *(undefined ***)prVar14 = &PTR__runtime_error_0080bf48;
      __cxa_throw(prVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (((int)local_a8 < 1) || (local_d4 < 1)) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"Dimension in <ElevationGrid> must be grater than zero.","");
      std::runtime_error::runtime_error(prVar14,(string *)&local_f8);
      *(undefined ***)prVar14 = &PTR__runtime_error_0080bf48;
      __cxa_throw(prVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 != (ulong)(uint)(local_d4 * (int)local_a8)) {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"Heights count must be equal to \"xDimension * zDimension\"",""
                );
      Throw_IncorrectAttrValue(pXVar8,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
    local_90 = (CX3DImporter_NodeElement *)operator_new(0x90);
    pCVar22 = pXVar8->NodeElement_Cur;
    local_90->Type = 0x13;
    (local_90->ID)._M_dataplus._M_p = (pointer)&(local_90->ID).field_2;
    iVar11 = 0;
    (local_90->ID)._M_string_length = 0;
    (local_90->ID).field_2._M_local_buf[0] = '\0';
    local_90->Parent = pCVar22;
    (local_90->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_90->Child;
    (local_90->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_90->Child;
    (local_90->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    *(CX3DImporter_NodeElement **)&local_90[1].Type = local_90 + 1;
    local_90[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(local_90 + 1);
    local_90[1].ID._M_dataplus._M_p = (pointer)0x0;
    local_90[1].ID._M_string_length = 0;
    local_90[1].ID.field_2._M_local_buf[0] = '\x01';
    local_90->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_ElevationGrid_008da888;
    *(undefined8 *)((long)&local_90[1].ID.field_2 + 8) = 0;
    local_90[1].Parent = (CX3DImporter_NodeElement *)0x0;
    local_90[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    local_80 = local_90;
    if (local_50._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_90->ID);
    }
    pCVar22 = local_90 + 1;
    this_00 = (vector<int,_std::allocator<int>_> *)
              (&local_90[1].ID.field_2._M_allocated_capacity + 1);
    pfVar20 = local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_98 = (float)iVar11 * local_d0;
      iVar21 = 0;
      do {
        local_88 = CONCAT44(local_88._4_4_,*pfVar20);
        p_Var13 = (_List_node_base *)operator_new(0x20);
        *(float *)&p_Var13[1]._M_next = (float)iVar21 * local_cc;
        *(int *)((long)&p_Var13[1]._M_next + 4) = (int)local_88;
        *(float *)&p_Var13[1]._M_prev = local_98;
        std::__detail::_List_node_base::_M_hook(p_Var13);
        (pCVar22->ID)._M_dataplus._M_p = (pCVar22->ID)._M_dataplus._M_p + 1;
        pfVar20 = pfVar20 + 1;
        iVar21 = iVar21 + 1;
      } while ((int)local_a8 != iVar21);
      iVar11 = iVar11 + 1;
    } while (iVar11 != local_d4);
    if (local_d4 < 2 || (int)local_a8 < 2) {
      local_90[1].ID._M_string_length = 2;
      pcVar5 = local_90[1].ID._M_dataplus._M_p;
      if (pcVar5 != (pointer)0x1) {
        pcVar23 = (pointer)0x0;
        do {
          local_f8._M_dataplus._M_p._0_4_ = (float)(int)pcVar23;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_f8);
          pcVar23 = pcVar23 + 1;
          local_f8._M_dataplus._M_p._0_4_ = SUB84(pcVar23,0);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_f8);
          local_f8._M_dataplus._M_p._0_4_ = -NAN;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_f8);
        } while (pcVar5 + -1 != pcVar23);
      }
    }
    else {
      local_90[1].ID._M_string_length = 4;
      local_d4 = local_d4 + -2;
      local_d0 = (float)((int)local_a8 + -1);
      uVar15 = 0;
      fVar19 = 1.4013e-45;
      uVar16 = local_a8;
      do {
        local_cc = (float)((int)uVar15 + 1);
        uVar24 = uVar16 & 0xffffffff;
        fVar17 = local_d0;
        local_98 = fVar19;
        local_88 = uVar15;
        do {
          iVar11 = (int)uVar24;
          if (local_f9 == false) {
            local_f8._M_dataplus._M_p._0_4_ = (float)((int)fVar19 + -1);
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_f8);
            local_f8._M_dataplus._M_p._0_4_ = fVar19;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_f8);
            local_f8._M_dataplus._M_p._0_4_ = (float)(iVar11 + 1);
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_f8);
            local_f8._M_dataplus._M_p._0_4_ = (float)iVar11;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_f8);
          }
          else {
            local_f8._M_dataplus._M_p._0_4_ = (float)iVar11;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_f8);
            local_f8._M_dataplus._M_p._0_4_ = (float)(iVar11 + 1);
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_f8);
            local_f8._M_dataplus._M_p._0_4_ = fVar19;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_f8);
            local_f8._M_dataplus._M_p._0_4_ = (float)((int)fVar19 + -1);
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_f8);
          }
          local_f8._M_dataplus._M_p._0_4_ = -NAN;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_f8);
          uVar24 = (ulong)(iVar11 + 1);
          fVar19 = (float)((int)fVar19 + 1);
          fVar17 = (float)((int)fVar17 + -1);
        } while (fVar17 != 0.0);
        uVar16 = (ulong)(uint)((int)uVar16 + (int)local_a8);
        fVar19 = (float)((int)local_98 + (int)local_a8);
        uVar15 = (ulong)(uint)local_cc;
      } while ((int)local_88 != local_d4);
    }
    pXVar8 = local_58;
    pCVar22 = local_90;
    local_90[1].ID.field_2._M_local_buf[2] = local_fb;
    local_90[1].ID.field_2._M_local_buf[1] = local_fc;
    *(float *)((long)&local_90[1].ID.field_2 + 4) = local_9c;
    local_90[1].ID.field_2._M_local_buf[0] = local_fa;
    iVar11 = (*(((local_58->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
               super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar11 == '\0') {
      ParseHelper_Node_Enter(pXVar8,pCVar22);
      paVar2 = &local_f8.field_2;
      do {
        do {
          while( true ) {
            iVar11 = (*(((pXVar8->mReader)._M_t.
                         super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                         .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                       super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
            if ((char)iVar11 == '\0') {
              local_f8._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f8,"ElevationGrid","");
              Throw_CloseNotFound(pXVar8,&local_f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != paVar2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
              goto LAB_00691686;
            }
            iVar11 = (*(((pXVar8->mReader)._M_t.
                         super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                         .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                       super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
            if (iVar11 != 1) break;
            local_f8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Color","");
            (*(((pXVar8->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
            iVar11 = std::__cxx11::string::compare((char *)&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != paVar2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if (iVar11 == 0) {
              ParseNode_Rendering_Color(pXVar8);
            }
            else {
              local_f8._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ColorRGBA","");
              (*(((pXVar8->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
              iVar11 = std::__cxx11::string::compare((char *)&local_f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != paVar2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
              if (iVar11 == 0) {
                ParseNode_Rendering_ColorRGBA(pXVar8);
              }
              else {
                local_f8._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Normal","");
                (*(((pXVar8->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                iVar11 = std::__cxx11::string::compare((char *)&local_f8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != paVar2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
                if (iVar11 == 0) {
                  ParseNode_Rendering_Normal(pXVar8);
                }
                else {
                  local_f8._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_f8,"TextureCoordinate","");
                  (*(((pXVar8->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                  iVar11 = std::__cxx11::string::compare((char *)&local_f8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f8._M_dataplus._M_p != paVar2) {
                    operator_delete(local_f8._M_dataplus._M_p,
                                    local_f8.field_2._M_allocated_capacity + 1);
                  }
                  if (iVar11 == 0) {
                    ParseNode_Texturing_TextureCoordinate(pXVar8);
                  }
                  else {
                    bVar9 = ParseHelper_CheckRead_X3DMetadataObject(pXVar8);
                    if (!bVar9) {
                      local_f8._M_dataplus._M_p = (pointer)paVar2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f8,"ElevationGrid","");
                      XML_CheckNode_SkipUnsupported(pXVar8,&local_f8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f8._M_dataplus._M_p != paVar2) {
                        operator_delete(local_f8._M_dataplus._M_p,
                                        local_f8.field_2._M_allocated_capacity + 1);
                      }
                    }
                  }
                }
              }
            }
          }
          iVar11 = (*(((pXVar8->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        } while (iVar11 != 2);
        local_f8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ElevationGrid","");
        (*(((pXVar8->mReader)._M_t.
            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
            super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
          super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
        iVar11 = std::__cxx11::string::compare((char *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
      } while (iVar11 != 0);
LAB_00691686:
      ParseHelper_Node_Exit(pXVar8);
      pCVar22 = local_90;
    }
    else {
      pCVar6 = pXVar8->NodeElement_Cur;
      p_Var13 = (_List_node_base *)operator_new(0x18);
      p_Var13[1]._M_next = (_List_node_base *)pCVar22;
      std::__detail::_List_node_base::_M_hook(p_Var13);
      psVar1 = &(pCVar6->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var13 = (_List_node_base *)operator_new(0x18);
    p_Var13[1]._M_next = (_List_node_base *)pCVar22;
    std::__detail::_List_node_base::_M_hook(p_Var13);
    plVar7 = &pXVar8->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(local_58);
    if (local_50._M_string_length != 0) {
      Throw_DEF_And_USE(pXVar8);
    }
    bVar9 = FindNodeElement(pXVar8,&local_c8,ENET_ElevationGrid,&local_80);
    if (!bVar9) {
      Throw_USE_NotFound(pXVar8,&local_c8);
    }
    pCVar22 = pXVar8->NodeElement_Cur;
    p_Var13 = (_List_node_base *)operator_new(0x18);
    p_Var13[1]._M_next = (_List_node_base *)local_80;
    std::__detail::_List_node_base::_M_hook(p_Var13);
    plVar7 = &pCVar22->Child;
  }
  psVar1 = &(plVar7->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry3D_ElevationGrid()
{
    std::string use, def;
    bool ccw = true;
    bool colorPerVertex = true;
    float creaseAngle = 0;
    std::vector<float> height;
    bool normalPerVertex = true;
    bool solid = true;
    int32_t xDimension = 0;
    float xSpacing = 1;
    int32_t zDimension = 0;
    float zSpacing = 1;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("creaseAngle", creaseAngle, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("height", height, XML_ReadNode_GetAttrVal_AsArrF);
		MACRO_ATTRREAD_CHECK_RET("xDimension", xDimension, XML_ReadNode_GetAttrVal_AsI32);
		MACRO_ATTRREAD_CHECK_RET("xSpacing", xSpacing, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("zDimension", zDimension, XML_ReadNode_GetAttrVal_AsI32);
		MACRO_ATTRREAD_CHECK_RET("zSpacing", zSpacing, XML_ReadNode_GetAttrVal_AsFloat);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_ElevationGrid, ne);
	}
	else
	{
		if((xSpacing == 0.0f) || (zSpacing == 0.0f)) throw DeadlyImportError("Spacing in <ElevationGrid> must be grater than zero.");
		if((xDimension <= 0) || (zDimension <= 0)) throw DeadlyImportError("Dimension in <ElevationGrid> must be grater than zero.");
		if((size_t)(xDimension * zDimension) != height.size()) Throw_IncorrectAttrValue("Heights count must be equal to \"xDimension * zDimension\"");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_ElevationGrid(CX3DImporter_NodeElement::ENET_ElevationGrid, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_ElevationGrid& grid_alias = *((CX3DImporter_NodeElement_ElevationGrid*)ne);// create alias for conveience

		{// create grid vertices list
			std::vector<float>::const_iterator he_it = height.begin();

			for(int32_t zi = 0; zi < zDimension; zi++)// rows
			{
				for(int32_t xi = 0; xi < xDimension; xi++)// columns
				{
					aiVector3D tvec(xSpacing * xi, *he_it, zSpacing * zi);

					grid_alias.Vertices.push_back(tvec);
					++he_it;
				}
			}
		}// END: create grid vertices list
		//
		// create faces list. In "coordIdx" format
		//
		// check if we have quads
		if((xDimension < 2) || (zDimension < 2))// only one element in dimension is set, create line set.
		{
			((CX3DImporter_NodeElement_ElevationGrid*)ne)->NumIndices = 2;// will be holded as line set.
			for(size_t i = 0, i_e = (grid_alias.Vertices.size() - 1); i < i_e; i++)
			{
				grid_alias.CoordIdx.push_back(static_cast<int32_t>(i));
				grid_alias.CoordIdx.push_back(static_cast<int32_t>(i + 1));
				grid_alias.CoordIdx.push_back(-1);
			}
		}
		else// two or more elements in every dimension is set. create quad set.
		{
			((CX3DImporter_NodeElement_ElevationGrid*)ne)->NumIndices = 4;
			for(int32_t fzi = 0, fzi_e = (zDimension - 1); fzi < fzi_e; fzi++)// rows
			{
				for(int32_t fxi = 0, fxi_e = (xDimension - 1); fxi < fxi_e; fxi++)// columns
				{
					// points direction in face.
					if(ccw)
					{
						// CCW:
						//	3 2
						//	0 1
						grid_alias.CoordIdx.push_back((fzi + 1) * xDimension + fxi);
						grid_alias.CoordIdx.push_back((fzi + 1) * xDimension + (fxi + 1));
						grid_alias.CoordIdx.push_back(fzi * xDimension + (fxi + 1));
						grid_alias.CoordIdx.push_back(fzi * xDimension + fxi);
					}
					else
					{
						// CW:
						//	0 1
						//	3 2
						grid_alias.CoordIdx.push_back(fzi * xDimension + fxi);
						grid_alias.CoordIdx.push_back(fzi * xDimension + (fxi + 1));
						grid_alias.CoordIdx.push_back((fzi + 1) * xDimension + (fxi + 1));
						grid_alias.CoordIdx.push_back((fzi + 1) * xDimension + fxi);
					}// if(ccw) else

					grid_alias.CoordIdx.push_back(-1);
				}// for(int32_t fxi = 0, fxi_e = (xDimension - 1); fxi < fxi_e; fxi++)
			}// for(int32_t fzi = 0, fzi_e = (zDimension - 1); fzi < fzi_e; fzi++)
		}// if((xDimension < 2) || (zDimension < 2)) else

		grid_alias.ColorPerVertex = colorPerVertex;
		grid_alias.NormalPerVertex = normalPerVertex;
		grid_alias.CreaseAngle = creaseAngle;
		grid_alias.Solid = solid;
        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("ElevationGrid");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("ElevationGrid");

			MACRO_NODECHECK_LOOPEND("ElevationGrid");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}// if(!mReader->isEmptyElement()) else

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}